

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall efsw::String::append(String *this,char *s)

{
  undefined1 local_38 [8];
  String tmp;
  char *s_local;
  String *this_local;
  
  tmp.mString.field_2._8_8_ = s;
  String((String *)local_38,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  append(&this->mString,
         (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_38);
  ~String((String *)local_38);
  return this;
}

Assistant:

String& String::append( const char* s ) {
	String tmp( s );

	mString.append( tmp.mString );

	return *this;
}